

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall
InstructionGenerator::genCreateInt(InstructionGenerator *this,string *identifier,uint val)

{
  uint local_4c;
  undefined1 local_48 [48];
  
  local_48._0_4_ = CHAR;
  local_4c = val;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,(Instruction *)local_48);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,&local_4c);
  Variable::Variable((Variable *)local_48,identifier,INT);
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  return;
}

Assistant:

void InstructionGenerator::genCreateInt(const std::string &identifier, unsigned int val)
{
    bytecode->emplace_back(Instruction::CREATE_INT);
    bytecode->emplace_back(val);
    push(Variable(identifier, DataType::INT));
}